

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field.cc
# Opt level: O1

int __thiscall
google::protobuf::compiler::java::ImmutableEnumFieldGenerator::GetNumBitsForMessage
          (ImmutableEnumFieldGenerator *this)

{
  FieldDescriptor *pFVar1;
  uint uVar2;
  long lVar3;
  
  pFVar1 = this->descriptor_;
  uVar2 = 0;
  if (*(int *)(pFVar1 + 0x3c) != 3) {
    lVar3 = google::protobuf::FieldDescriptor::message_type();
    uVar2 = 1;
    if (((lVar3 == 0) && (pFVar1[0x41] == (FieldDescriptor)0x0)) &&
       ((*(int *)(*(long *)(pFVar1 + 0x28) + 0x3c) != 2 ||
        ((*(int *)(pFVar1 + 0x3c) != 1 || (*(long *)(pFVar1 + 0x58) != 0)))))) {
      uVar2 = (uint)(*(int *)(*(long *)(pFVar1 + 0x28) + 0x3c) == 2);
    }
  }
  return uVar2;
}

Assistant:

int ImmutableEnumFieldGenerator::GetNumBitsForMessage() const {
  return SupportFieldPresence(descriptor_) ? 1 : 0;
}